

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

bool __thiscall ONX_Model::Write(ONX_Model *this,char *filename,int version,ON_TextLog *error_log)

{
  FILE *fp_00;
  wchar_t *archive_full_path;
  ON_wString local_270;
  ON_wString wFileName;
  ON_BinaryFile file;
  FILE *fp;
  bool rc;
  ON_TextLog *error_log_local;
  int version_local;
  char *filename_local;
  ONX_Model *this_local;
  
  fp._7_1_ = false;
  if (((filename != (char *)0x0) && (*filename != '\0')) &&
     (fp_00 = ON::OpenFile(filename,"wb"), fp_00 != (FILE *)0x0)) {
    ON_BinaryFile::ON_BinaryFile((ON_BinaryFile *)&wFileName,write3dm,fp_00);
    ON_wString::ON_wString(&local_270,filename);
    archive_full_path = ON_wString::operator_cast_to_wchar_t_(&local_270);
    ON_BinaryArchive::SetArchiveFullPath((ON_BinaryArchive *)&wFileName,archive_full_path);
    fp._7_1_ = Write(this,(ON_BinaryArchive *)&wFileName,version,error_log);
    ON::CloseFile(fp_00);
    ON_wString::~ON_wString(&local_270);
    ON_BinaryFile::~ON_BinaryFile((ON_BinaryFile *)&wFileName);
  }
  return fp._7_1_;
}

Assistant:

bool ONX_Model::Write(const char* filename, int version, ON_TextLog* error_log) const
{
  bool rc = false;

  if (nullptr != filename && 0 != filename[0])
  {
    FILE* fp = ON::OpenFile(filename, "wb");
    if (nullptr != fp)
    {
      ON_BinaryFile file(ON::archive_mode::write3dm, fp);
      const ON_wString wFileName(filename);
      file.SetArchiveFullPath(static_cast<const wchar_t*>(wFileName));
      rc = Write(file, version, error_log);
      ON::CloseFile(fp);
    }
  }

  return rc;
}